

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isAlterableTable(Parse *pParse,Table *pTab)

{
  char *zLeft;
  sqlite3 *psVar1;
  int iVar2;
  
  zLeft = pTab->zName;
  iVar2 = sqlite3_strnicmp(zLeft,"sqlite_",7);
  if ((iVar2 != 0) && (-1 < (short)pTab->tabFlags)) {
    if ((pTab->tabFlags >> 0xc & 1) == 0) {
      return 0;
    }
    psVar1 = pParse->db;
    if ((psVar1->flags & 0x10000000) == 0) {
      return 0;
    }
    if (psVar1->pVtabCtx != (VtabCtx *)0x0) {
      return 0;
    }
    if (psVar1->nVdbeExec != 0) {
      return 0;
    }
    if ((0 < psVar1->nVTrans) && (psVar1->aVTrans == (VTable **)0x0)) {
      return 0;
    }
  }
  sqlite3ErrorMsg(pParse,"table %s may not be altered",zLeft);
  return 1;
}

Assistant:

static int isAlterableTable(Parse *pParse, Table *pTab){
  if( 0==sqlite3StrNICmp(pTab->zName, "sqlite_", 7)
#ifndef SQLITE_OMIT_VIRTUALTABLE
   || (pTab->tabFlags & TF_Eponymous)!=0
   || ( (pTab->tabFlags & TF_Shadow)!=0
        && sqlite3ReadOnlyShadowTables(pParse->db)
   )
#endif
  ){
    sqlite3ErrorMsg(pParse, "table %s may not be altered", pTab->zName);
    return 1;
  }
  return 0;
}